

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.h
# Opt level: O1

bool __thiscall RDNSequence::Decode(RDNSequence *this,uchar *pIn,size_t cbIn,size_t *cbUsed)

{
  size_t *out;
  long lVar1;
  size_t sVar2;
  bool bVar3;
  DecodeResult DVar4;
  size_t sVar5;
  byte bVar6;
  undefined1 local_88 [8];
  RelativeDistinguishedName rdn;
  undefined1 auStack_58 [8];
  SequenceHelper sh;
  
  auStack_58 = (undefined1  [8])0x0;
  sh.dataSize = 0;
  sh.prefixSize = 0;
  sh.cbUsed._0_1_ = 0;
  rdn.attrs.super__Vector_base<AttributeTypeAndValue,_std::allocator<AttributeTypeAndValue>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pIn;
  sh.cbCurrent = (size_t)cbUsed;
  DVar4 = SequenceHelper::Init((SequenceHelper *)auStack_58,pIn,cbIn,&(this->super_DerBase).cbData);
  if (DVar4 < Success) {
    bVar6 = 6 >> ((byte)DVar4 & 7);
  }
  else {
    out = &rdn.super_DerBase.cbData;
    do {
      sVar5 = SequenceHelper::DataSize((SequenceHelper *)auStack_58);
      sVar2 = sh.dataSize;
      bVar6 = sVar5 == 0;
      if ((bool)bVar6) break;
      rdn.super_DerBase._vptr_DerBase = (_func_int **)0x0;
      local_88 = (undefined1  [8])&PTR_EncodedSize_001501c0;
      rdn.attrs.super__Vector_base<AttributeTypeAndValue,_std::allocator<AttributeTypeAndValue>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      rdn.super_DerBase.cbData = 0;
      rdn.attrs.super__Vector_base<AttributeTypeAndValue,_std::allocator<AttributeTypeAndValue>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      lVar1 = *(long *)sh.cbCurrent;
      sVar5 = SequenceHelper::DataSize((SequenceHelper *)auStack_58);
      bVar3 = DerBase::DecodeSet<AttributeTypeAndValue>
                        ((uchar *)((long)&((rdn.attrs.
                                            super__Vector_base<AttributeTypeAndValue,_std::allocator<AttributeTypeAndValue>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                          super_DerBase)._vptr_DerBase + sVar2 + lVar1),sVar5,
                         &sh.prefixSize,
                         (vector<AttributeTypeAndValue,_std::allocator<AttributeTypeAndValue>_> *)
                         out);
      if (!bVar3) {
        std::vector<AttributeTypeAndValue,_std::allocator<AttributeTypeAndValue>_>::~vector
                  ((vector<AttributeTypeAndValue,_std::allocator<AttributeTypeAndValue>_> *)out);
        break;
      }
      std::vector<RelativeDistinguishedName,_std::allocator<RelativeDistinguishedName>_>::push_back
                (&this->name,(value_type *)local_88);
      *(size_t *)sh.cbCurrent = *(long *)sh.cbCurrent + sh.prefixSize;
      sh.prefixSize = 0;
      std::vector<AttributeTypeAndValue,_std::allocator<AttributeTypeAndValue>_>::~vector
                ((vector<AttributeTypeAndValue,_std::allocator<AttributeTypeAndValue>_> *)out);
    } while (bVar3);
  }
  *(size_t *)sh.cbCurrent = *(long *)sh.cbCurrent + sh.prefixSize;
  sh.prefixSize = 0;
  SequenceHelper::CheckExit((SequenceHelper *)auStack_58);
  *(size_t *)sh.cbCurrent = *(long *)sh.cbCurrent + sh.dataSize;
  return (bool)(bVar6 & 1);
}

Assistant:

virtual bool Decode(const unsigned char * pIn, size_t cbIn, size_t & cbUsed) override
	{
        SequenceHelper sh(cbUsed);

        switch (sh.Init(pIn, cbIn, this->cbData))
        {
        case DecodeResult::Failed:
            return false;
        case DecodeResult::Null:
        case DecodeResult::EmptySequence:
            return true;
        case DecodeResult::Success:
            break;
        }

        // This is a sequence of sets of AttributeTypeAndValue
        for (size_t item = 0; sh.DataSize() > 0; ++item)
        {
            RelativeDistinguishedName rdn;
            if (!rdn.Decode(sh.DataPtr(pIn), sh.DataSize(), sh.CurrentSize()))
                return false;

            name.push_back(rdn);
            sh.Update();
        }

        return true;
	}